

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetDebugDetach(zet_debug_session_handle_t hDebug)

{
  zet_pfnDebugDetach_t pfnDetach;
  ze_result_t result;
  zet_debug_session_handle_t hDebug_local;
  
  pfnDetach._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c960 != (code *)0x0) {
    pfnDetach._4_4_ = (*DAT_0011c960)(hDebug);
  }
  return pfnDetach._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugDetach(
        zet_debug_session_handle_t hDebug               ///< [in][release] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDetach = context.zetDdiTable.Debug.pfnDetach;
        if( nullptr != pfnDetach )
        {
            result = pfnDetach( hDebug );
        }
        else
        {
            // generic implementation

        }

        return result;
    }